

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

bool __thiscall
ImTriangulator::IsEar(ImTriangulator *this,int i0,int i1,int i2,ImVec2 *v0,ImVec2 *v1,ImVec2 *v2)

{
  int iVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  ImVec2 *in_R8;
  ImVec2 *in_R9;
  ImTriangulatorNode *reflex;
  ImTriangulatorNode **p;
  ImTriangulatorNode **p_end;
  long *local_40;
  
  lVar2 = *(long *)(in_RDI + 0x20);
  iVar1 = *(int *)(in_RDI + 0x28);
  local_40 = *(long **)(in_RDI + 0x20);
  while( true ) {
    if ((long *)(lVar2 + (long)iVar1 * 8) <= local_40) {
      return true;
    }
    lVar3 = *local_40;
    if ((((*(int *)(lVar3 + 4) != in_ESI) && (*(int *)(lVar3 + 4) != in_EDX)) &&
        (*(int *)(lVar3 + 4) != in_ECX)) &&
       (bVar4 = ImTriangleContainsPoint(in_R8,in_R9,(ImVec2 *)p,(ImVec2 *)(lVar3 + 8)), bVar4))
    break;
    local_40 = local_40 + 1;
  }
  return false;
}

Assistant:

bool ImTriangulator::IsEar(int i0, int i1, int i2, const ImVec2& v0, const ImVec2& v1, const ImVec2& v2) const
{
    ImTriangulatorNode** p_end = _Reflexes.Data + _Reflexes.Size;
    for (ImTriangulatorNode** p = _Reflexes.Data; p < p_end; p++)
    {
        ImTriangulatorNode* reflex = *p;
        if (reflex->Index != i0 && reflex->Index != i1 && reflex->Index != i2)
            if (ImTriangleContainsPoint(v0, v1, v2, reflex->Pos))
                return false;
    }
    return true;
}